

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_set.h
# Opt level: O2

variable_set * __thiscall merlin::variable_set::operator=(variable_set *this,variable_set *B)

{
  allocator_type local_29;
  vector<unsigned_long,std::allocator<unsigned_long>> local_28 [24];
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(&this->m_v,&B->m_v);
  std::vector<unsigned_long,std::allocator<unsigned_long>>::vector<unsigned_long_const*,void>
            (local_28,B->m_d,
             (unsigned_long *)
             (((long)(B->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)(B->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start) + (long)B->m_d),&local_29);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
            (&this->m_dlocal,local_28);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  this->m_d = (this->m_dlocal).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
  return this;
}

Assistant:

variable_set& operator=(const variable_set& B) {
		m_v = B.m_v;
		m_dlocal = std::vector < vsize > (B.m_d, B.m_d + B.size());
		m_d = &m_dlocal[0];
		return *this;
	}